

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

Marray<int,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::operator=
          (Marray<int,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>,_int>
          *expression)

{
  bool bVar1;
  int *piVar2;
  size_t sVar3;
  size_t *psVar4;
  CoordinateOrder *pCVar5;
  size_t j;
  ulong j_00;
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator_type local_71;
  Marray<int,_std::allocator<unsigned_long>_> local_70;
  
  bVar1 = BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Plus<int,int,int>>
          ::overlaps<int,false,std::allocator<unsigned_long>>
                    ((BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Plus<int,int,int>>
                      *)expression,(View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (bVar1) {
    Marray<andres::BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Plus<int,int,int>>,int>
              ((Marray<int,std::allocator<unsigned_long>> *)&local_70,expression,&local_71);
    Marray<int,_std::allocator<unsigned_long>_>::operator=
              ((Marray<int,_std::allocator<unsigned_long>_> *)this,&local_70);
    Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_70);
  }
  else {
    if (*(long *)(this + 0x30) != *(long *)(*(long *)expression + 0x30)) {
      operator_delete(*(void **)this,*(long *)(this + 0x30) << 2);
      piVar2 = __gnu_cxx::new_allocator<int>::allocate
                         ((new_allocator<int> *)(this + 0x40),
                          *(size_type *)(*(long *)expression + 0x30),(void *)0x0);
      *(int **)this = piVar2;
    }
    sVar3 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
            ::dimension((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                         *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),sVar3);
    j_00 = 0;
    while( true ) {
      sVar3 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
              ::dimension((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                           *)expression);
      if (sVar3 <= j_00) break;
      sVar3 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
              ::shape((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                       *)expression,j_00);
      psVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                         ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),j_00);
      *psVar4 = sVar3;
      j_00 = j_00 + 1;
    }
    *(undefined8 *)(this + 0x30) = *(undefined8 *)(*(long *)expression + 0x30);
    this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
    pCVar5 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
             ::coordinateOrder((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                                *)expression);
    *(CoordinateOrder *)(this + 0x38) = *pCVar5;
    if (*(long *)(this + 0x28) != 0) {
      marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
                (*(unsigned_long **)(this + 0x10),
                 *(unsigned_long **)(this + 0x10) + *(long *)(this + 0x28),
                 *(unsigned_long **)(this + 0x18),(CoordinateOrder *)(this + 0x38));
      marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
                (*(unsigned_long **)(this + 0x10),
                 *(unsigned_long **)(this + 0x10) + *(long *)(this + 0x28),
                 *(unsigned_long **)(this + 0x20),(CoordinateOrder *)(this + 0x38));
    }
    marray_detail::
    operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Plus<int,int,int>>,int>
              (this,expression);
  }
  return (Marray<int,_std::allocator<unsigned_long>_> *)this;
}

Assistant:

inline Marray<T, A>&
Marray<T, A>::operator=
(
    const ViewExpression<E, Te>& expression
)
{
    if(expression.overlaps(*this)) {
        Marray<T, A> m(expression); // temporary copy
        (*this) = m; // recursive call
    }
    else {
        // re-allocate memory (if necessary)
        if(this->size() != expression.size()) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = dataAllocator_.allocate(expression.size());
        }
        
        // copy geometry
        this->geometry_.resize(expression.dimension());
        for(std::size_t j=0; j<expression.dimension(); ++j) {
            this->geometry_.shape(j) = expression.shape(j);
        }
        this->geometry_.size() = expression.size();
        this->geometry_.isSimple() = true;
        this->geometry_.coordinateOrder() = expression.coordinateOrder();
        if(this->geometry_.dimension() != 0) {
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.shapeStridesBegin(), this->geometry_.coordinateOrder());
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.stridesBegin(), this->geometry_.coordinateOrder());
        }
        
        // copy data
        marray_detail::operate(*this, expression, marray_detail::Assign<T, Te>());
    }
    return *this;
}